

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

void smallDeletions(RefVector *ref,vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersUp,
                   vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersDown,
                   vector<OutNode,_std::allocator<OutNode>_> *smallOutput)

{
  SoftCluster *pSVar1;
  int iVar2;
  pointer pSVar3;
  pointer pSVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  SoftCluster *pSVar8;
  const_reference pvVar9;
  pair<int,_int> pVar10;
  const_reference pvVar11;
  ulong __n;
  ulong uVar12;
  int local_11c;
  OutNode on;
  SoftCluster scUp;
  
  pSVar1 = (scClustersUp->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar8 = (scClustersUp->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
                _M_impl.super__Vector_impl_data._M_start; pSVar8 != pSVar1; pSVar8 = pSVar8 + 1) {
    SoftCluster::SoftCluster(&scUp,pSVar8);
    uVar6 = getIdx(scUp.info.scPos + 0x2d,scClustersDown);
    if (uVar6 != 0xffffffff) {
      __n = (ulong)uVar6;
      local_11c = 0;
      uVar12 = 0xffffffffffffffff;
      while ((__n < (ulong)(((long)(scClustersDown->
                                   super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(scClustersDown->
                                  super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
                                  _M_impl.super__Vector_impl_data._M_start) / 0x90) &&
             (pvVar9 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                                 (scClustersDown,__n),
             (pvVar9->info).scPos - scUp.info.scPos < 0x1fa))) {
        pvVar9 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at(scClustersDown,__n);
        iVar7 = local_11c;
        if (0x2c < (pvVar9->info).scPos - scUp.info.scPos) {
          pvVar9 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at(scClustersDown,__n);
          bVar5 = overlapCC(&scUp,pvVar9);
          pSVar4 = scUp.nodes.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pSVar3 = scUp.nodes.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (bVar5) {
            pvVar9 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at(scClustersDown,__n);
            iVar7 = (int)(((long)(pvVar9->nodes).
                                 super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(pvVar9->nodes).
                                super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x78) +
                    (int)(((long)pSVar4 - (long)pSVar3) / 0x78);
            if (local_11c < iVar7) {
              uVar12 = __n;
            }
            uVar12 = uVar12 & 0xffffffff;
            if (iVar7 < local_11c) {
              iVar7 = local_11c;
            }
          }
        }
        local_11c = iVar7;
        __n = __n + 1;
      }
      iVar7 = (int)uVar12;
      if (iVar7 != -1) {
        pvVar9 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                           (scClustersDown,(long)iVar7);
        pVar10 = calcSup(&scUp.nodes,&pvVar9->nodes);
        pvVar11 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                            (ref,(long)scUp.info.refID);
        iVar2 = scUp.info.scPos;
        pvVar9 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                           (scClustersDown,(long)iVar7);
        iVar7 = (pvVar9->info).scPos;
        std::__cxx11::string::string((string *)&on,(string *)pvVar11);
        on.st = iVar2;
        on.supDisc = 0;
        on.supSR = pVar10.first;
        on.supSC = pVar10.second;
        on.en = iVar7;
        std::vector<OutNode,std::allocator<OutNode>>::emplace_back<OutNode&>
                  ((vector<OutNode,std::allocator<OutNode>> *)smallOutput,&on);
        std::__cxx11::string::~string((string *)&on);
      }
    }
    SoftCluster::~SoftCluster(&scUp);
  }
  return;
}

Assistant:

void smallDeletions(const BamTools::RefVector &ref, const std::vector<SoftCluster> &scClustersUp, const std::vector<SoftCluster> &scClustersDown, std::vector<OutNode> &smallOutput)
{
	for (SoftCluster scUp : scClustersUp)
	{
		int stBound = getIdx(scUp.info.scPos + MIN_SMALL_DEL_LEN, scClustersDown);

		if (stBound == -1)
			continue;

		int bestIdx = -1, bestSup = 0;
		for (int i = stBound; i < scClustersDown.size(); ++i)
		{
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos > MAX_SMALL_DEL_LEN)
				break;
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos < MIN_SMALL_DEL_LEN)
				continue;
			if (overlapCC(scUp, scClustersDown.at(i)))
			{
				int curSup = scUp.nodes.size() + scClustersDown.at(i).nodes.size();
				if (curSup > bestSup)
				{
					bestSup = curSup;
					bestIdx = i;
				}
			}
		}
		if (bestIdx != -1)
		{
			std::pair<int, int> sup = calcSup(scUp.nodes, scClustersDown.at(bestIdx).nodes);
			OutNode on(ref.at(scUp.info.refID).RefName, scUp.info.scPos, scClustersDown.at(bestIdx).info.scPos, 0, sup.first, sup.second);
			smallOutput.emplace_back(on);
		}
	}
}